

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O3

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::MembraneHook::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,MembraneHook *this,
          uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint,CallHints hints
          )

{
  uint *puVar1;
  bool bVar2;
  ClientHook *pCVar3;
  MembranePolicy *pMVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Builder builder;
  MembraneHook *pMVar8;
  capnp cVar9;
  undefined8 uVar10;
  Disposer *pDVar11;
  PromiseBase node;
  CapTableBuilder *pCVar12;
  byte bVar13;
  int iVar14;
  RequestHook *pRVar15;
  char *condition;
  undefined6 in_register_0000008a;
  ulong uVar16;
  char *macroArgs;
  MembraneRequestHook *ptrCopy;
  DebugComparison<capnp::_::CapTableBuilder_*,_capnp::(anonymous_namespace)::MembraneCapTableBuilder_*>
  _kjCondition;
  Maybe<capnp::Capability::Client> redirect;
  DebugComparison<capnp::_::CapTableBuilder_*,_capnp::(anonymous_namespace)::MembraneCapTableBuilder_*>
  *in_stack_fffffffffffffe88;
  undefined1 local_158 [12];
  undefined4 uStack_14c;
  MembranePolicy *local_148;
  undefined8 local_140;
  undefined1 local_138;
  undefined1 local_130 [32];
  Disposer *local_110;
  PromiseBase local_108;
  MembraneHook *pMStack_100;
  MembranePolicy *local_f8;
  bool local_f0 [8];
  Disposer *local_e8;
  ClientHook *local_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  CapTableBuilder *pCStack_d0;
  undefined4 local_c8;
  undefined4 uStack_c4;
  CapTableBuilder *pCStack_c0;
  PointerBuilder local_b8;
  Fault local_a0;
  Request<capnp::AnyPointer,_capnp::AnyPointer> *local_98;
  char local_90 [8];
  undefined4 local_88;
  undefined4 uStack_84;
  uint uStack_80;
  undefined4 uStack_7c;
  char local_78 [8];
  undefined4 local_70;
  undefined4 uStack_6c;
  uint uStack_68;
  undefined4 uStack_64;
  char local_60 [8];
  undefined4 local_58;
  undefined4 uStack_54;
  uint uStack_50;
  undefined4 uStack_4c;
  char local_48 [8];
  uint64_t local_40;
  undefined8 uStack_38;
  
  uVar16 = CONCAT62(in_register_0000008a,hints);
  pCVar3 = (this->resolved).ptr.ptr;
  if (pCVar3 != (ClientHook *)0x0) {
    local_48[0] = (sizeHint->ptr).isSet;
    if ((bool)local_48[0] == true) {
      local_40 = (sizeHint->ptr).field_1.value.wordCount;
      uStack_38 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (**pCVar3->_vptr_ClientHook)
              (__return_storage_ptr__,pCVar3,interfaceId,methodId,local_48,uVar16 & 0xffffffff);
    return __return_storage_ptr__;
  }
  pMVar4 = (this->policy).ptr;
  if (this->reverse == true) {
    local_98 = __return_storage_ptr__;
    (*((this->inner).ptr)->_vptr_ClientHook[4])(local_158);
    local_c8 = local_158._0_4_;
    uStack_c4 = local_158._4_4_;
    pCStack_c0 = (CapTableBuilder *)stack0xfffffffffffffeb0;
    stack0xfffffffffffffeb0 = (MembraneHook *)0x0;
    (*pMVar4->_vptr_MembranePolicy[1])(local_f0,pMVar4,interfaceId,methodId);
    pCVar12 = pCStack_c0;
    if (pCStack_c0 != (CapTableBuilder *)0x0) {
      pCStack_c0 = (CapTableBuilder *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_c4,local_c8))
                ((undefined8 *)CONCAT44(uStack_c4,local_c8),
                 (pCVar12->super_CapTableReader)._vptr_CapTableReader[-2] +
                 (long)&pCVar12->super_CapTableReader);
    }
    __return_storage_ptr__ = local_98;
    pMVar8 = stack0xfffffffffffffeb0;
    if (stack0xfffffffffffffeb0 != (MembraneHook *)0x0) {
      stack0xfffffffffffffeb0 = (MembraneHook *)0x0;
      (*(code *)((SegmentReader *)local_158._0_8_)->arena->_vptr_Arena)
                (local_158._0_8_,
                 (long)((SegmentReader *)&pMVar8->super_ClientHook)->arena[-2]._vptr_Arena +
                 (long)&((SegmentReader *)&pMVar8->super_ClientHook)->arena);
    }
  }
  else {
    (*((this->inner).ptr)->_vptr_ClientHook[4])(local_158);
    local_d8 = local_158._0_4_;
    uStack_d4 = local_158._4_4_;
    pCStack_d0 = (CapTableBuilder *)stack0xfffffffffffffeb0;
    stack0xfffffffffffffeb0 = (MembraneHook *)0x0;
    (**pMVar4->_vptr_MembranePolicy)(local_f0,pMVar4,interfaceId,methodId);
    pCVar12 = pCStack_d0;
    if (pCStack_d0 != (CapTableBuilder *)0x0) {
      pCStack_d0 = (CapTableBuilder *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_d4,local_d8))
                ((undefined8 *)CONCAT44(uStack_d4,local_d8),
                 (pCVar12->super_CapTableReader)._vptr_CapTableReader[-2] +
                 (long)&pCVar12->super_CapTableReader);
    }
    pMVar8 = stack0xfffffffffffffeb0;
    if (stack0xfffffffffffffeb0 != (MembraneHook *)0x0) {
      stack0xfffffffffffffeb0 = (MembraneHook *)0x0;
      (*(code *)((SegmentReader *)local_158._0_8_)->arena->_vptr_Arena)
                (local_158._0_8_,
                 (long)((SegmentReader *)&pMVar8->super_ClientHook)->arena[-2]._vptr_Arena +
                 (long)&((SegmentReader *)&pMVar8->super_ClientHook)->arena);
    }
  }
  if (local_f0[0] == true) {
    iVar14 = (*((this->policy).ptr)->_vptr_MembranePolicy[4])();
    if ((char)iVar14 != '\0') {
      whenMoreResolved((MembraneHook *)local_130);
      cVar9 = local_130[0];
      local_158[0] = (byte)local_130[0];
      if (local_130[0] == (capnp)0x0) {
        bVar13 = 0;
      }
      else {
        stack0xfffffffffffffeb0 = (MembraneHook *)local_130._8_8_;
        puVar1 = &(this->super_Refcounted).refcount;
        *puVar1 = *puVar1 + 1;
        local_b8.segment = (SegmentBuilder *)&this->super_Refcounted;
        local_b8.capTable = (CapTableBuilder *)this;
        kj::Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>>::
        attach<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                  ((Promise<kj::Own<capnp::ClientHook,decltype(nullptr)>> *)&local_108,
                   (Own<capnp::ClientHook,_std::nullptr_t> *)(local_158 + 8));
        newLocalPromiseClient
                  ((capnp *)local_130,
                   (Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&local_108);
        local_60[0] = (sizeHint->ptr).isSet;
        if ((bool)local_60[0] == true) {
          local_58 = *(undefined4 *)&(sizeHint->ptr).field_1;
          uStack_54 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
          uStack_50 = (sizeHint->ptr).field_1.value.capCount;
          uStack_4c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
        }
        (*(code *)((SegmentReader *)local_130._8_8_)->arena->_vptr_Arena)
                  (__return_storage_ptr__,local_130._8_8_,interfaceId,methodId,local_60,
                   uVar16 & 0xffffffff);
        uVar10 = local_130._8_8_;
        if ((MembraneHook *)local_130._8_8_ != (MembraneHook *)0x0) {
          local_130._8_8_ = (MembraneHook *)0x0;
          (*(code *)**(undefined8 **)CONCAT44(local_130._4_4_,local_130._0_4_))
                    ((undefined8 *)CONCAT44(local_130._4_4_,local_130._0_4_),
                     (long)&((SegmentReader *)uVar10)->arena +
                     (long)((SegmentReader *)uVar10)->arena[-2]._vptr_Arena);
        }
        node.node.ptr = local_108.node.ptr;
        if (local_108.node.ptr != (PromiseNode *)0x0) {
          local_108.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
        }
        pCVar12 = local_b8.capTable;
        if ((MembraneHook *)local_b8.capTable != (MembraneHook *)0x0) {
          local_b8.capTable = (CapTableBuilder *)0x0;
          (*(code *)(((local_b8.segment)->super_SegmentReader).arena)->_vptr_Arena)
                    (local_b8.segment,
                     (long)&((SegmentReader *)&pCVar12->super_CapTableReader)->arena +
                     (long)((SegmentReader *)&pCVar12->super_CapTableReader)->arena[-2]._vptr_Arena)
          ;
        }
        bVar13 = local_158[0];
      }
      pMVar8 = stack0xfffffffffffffeb0;
      if (((bVar13 & 1) != 0) && (stack0xfffffffffffffeb0 != (MembraneHook *)0x0)) {
        stack0xfffffffffffffeb0 = (MembraneHook *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)pMVar8);
      }
      if (cVar9 != (capnp)0x0) goto LAB_00315526;
    }
    pCVar3 = local_e0;
    pDVar11 = local_e8;
    local_e0 = (ClientHook *)0x0;
    local_78[0] = (sizeHint->ptr).isSet;
    if ((bool)local_78[0] == true) {
      local_70 = *(undefined4 *)&(sizeHint->ptr).field_1;
      uStack_6c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      uStack_68 = (sizeHint->ptr).field_1.value.capCount;
      uStack_64 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    (**pCVar3->_vptr_ClientHook)
              (__return_storage_ptr__,pCVar3,interfaceId,methodId,local_78,uVar16 & 0xffffffff);
    (**pDVar11->_vptr_Disposer)
              (pDVar11,(_func_int *)
                       ((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]));
  }
  else {
    pCVar3 = (this->inner).ptr;
    local_90[0] = (sizeHint->ptr).isSet;
    if ((bool)local_90[0] == true) {
      local_88 = *(undefined4 *)&(sizeHint->ptr).field_1;
      uStack_84 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      uStack_80 = (sizeHint->ptr).field_1.value.capCount;
      uStack_7c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    condition = local_90;
    macroArgs = (char *)(uVar16 & 0xffffffff);
    (**pCVar3->_vptr_ClientHook)(local_130,pCVar3,interfaceId,methodId);
    pDVar11 = local_110;
    uVar10 = local_130._24_8_;
    pMVar4 = (this->policy).ptr;
    bVar2 = this->reverse;
    local_f8 = (MembranePolicy *)local_130._16_8_;
    local_108.node.ptr._4_4_ = local_130._4_4_;
    local_108.node.ptr._0_4_ = local_130._0_4_;
    pMStack_100 = (MembraneHook *)local_130._8_8_;
    local_110 = (Disposer *)0x0;
    if (((pDVar11[1]._vptr_Disposer == (_func_int **)&(anonymous_namespace)::DUMMY) &&
        ((MembranePolicy *)pDVar11[5]._vptr_Disposer == pMVar4)) &&
       ((bool)*(char *)&pDVar11[6]._vptr_Disposer != bVar2)) {
      local_b8.pointer = (WirePointer *)local_130._16_8_;
      local_b8.segment = (SegmentBuilder *)CONCAT44(local_130._4_4_,local_130._0_4_);
      local_b8.capTable = (CapTableBuilder *)local_130._8_8_;
      local_158._0_8_ = capnp::_::PointerBuilder::getCapTable(&local_b8);
      unique0x00004780 = (MembraneHook *)(pDVar11 + 7);
      local_148 = (MembranePolicy *)0x4d6514;
      local_140 = 5;
      local_138 = (MembraneHook *)local_158._0_8_ == unique0x00004780;
      if (!(bool)local_138) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::CapTableBuilder*,capnp::(anonymous_namespace)::MembraneCapTableBuilder*>&>
                  (&local_a0,local_158,0x4d6514,(Type)unique0x00004780,condition,macroArgs,
                   in_stack_fffffffffffffe88);
        kj::_::Debug::Fault::fatal(&local_a0);
      }
      capnp::_::PointerBuilder::imbue
                ((PointerBuilder *)local_158,&local_b8,(CapTableBuilder *)pDVar11[8]._vptr_Disposer)
      ;
      local_f8 = local_148;
      local_108.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_158._0_8_;
      pMStack_100 = stack0xfffffffffffffeb0;
      (__return_storage_ptr__->super_Builder).builder.pointer = (WirePointer *)local_148;
      (__return_storage_ptr__->super_Builder).builder.segment = (SegmentBuilder *)local_158._0_8_;
      (__return_storage_ptr__->super_Builder).builder.capTable =
           (CapTableBuilder *)stack0xfffffffffffffeb0;
      uVar5 = *(undefined4 *)((long)&pDVar11[2]._vptr_Disposer + 4);
      uVar6 = *(undefined4 *)&pDVar11[3]._vptr_Disposer;
      uVar7 = *(undefined4 *)((long)&pDVar11[3]._vptr_Disposer + 4);
      *(undefined4 *)&(__return_storage_ptr__->hook).disposer =
           *(undefined4 *)&pDVar11[2]._vptr_Disposer;
      *(undefined4 *)((long)&(__return_storage_ptr__->hook).disposer + 4) = uVar5;
      *(undefined4 *)&(__return_storage_ptr__->hook).ptr = uVar6;
      *(undefined4 *)((long)&(__return_storage_ptr__->hook).ptr + 4) = uVar7;
      pDVar11[3]._vptr_Disposer = (_func_int **)0x0;
      (**(code **)*(_func_int **)uVar10)
                (uVar10,pDVar11->_vptr_Disposer[-2] + (long)&pDVar11->_vptr_Disposer);
    }
    else {
      (*pMVar4->_vptr_MembranePolicy[2])(local_158);
      pRVar15 = (RequestHook *)operator_new(0x58);
      pRVar15->brand = &(anonymous_namespace)::MEMBRANE_BRAND;
      pRVar15->_vptr_RequestHook = (_func_int **)&PTR_send_006cda18;
      pRVar15[1]._vptr_RequestHook = (_func_int **)uVar10;
      pRVar15[1].brand = pDVar11;
      pRVar15[2]._vptr_RequestHook = (_func_int **)local_158._0_8_;
      pRVar15[2].brand = stack0xfffffffffffffeb0;
      *(bool *)&pRVar15[3]._vptr_RequestHook = bVar2;
      pRVar15[3].brand = &PTR_extractCap_006cda58;
      pRVar15[4]._vptr_RequestHook = (_func_int **)0x0;
      pRVar15[4].brand = stack0xfffffffffffffeb0;
      *(bool *)&pRVar15[5]._vptr_RequestHook = bVar2;
      builder.builder.capTable = (CapTableBuilder *)pMStack_100;
      builder.builder.segment = (SegmentBuilder *)local_108.node.ptr;
      builder.builder.pointer = (WirePointer *)local_f8;
      anon_unknown_0::MembraneCapTableBuilder::imbue
                ((Builder *)local_158,(MembraneCapTableBuilder *)&pRVar15[3].brand,builder);
      local_f8 = local_148;
      local_108.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_158._0_8_;
      pMStack_100 = stack0xfffffffffffffeb0;
      (__return_storage_ptr__->super_Builder).builder.pointer = (WirePointer *)local_148;
      *(undefined4 *)&(__return_storage_ptr__->super_Builder).builder.segment = local_158._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->super_Builder).builder.segment + 4) =
           local_158._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->super_Builder).builder.capTable = local_158._8_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->super_Builder).builder.capTable + 4) =
           uStack_14c;
      (__return_storage_ptr__->hook).disposer =
           (Disposer *)
           &kj::_::HeapDisposer<capnp::(anonymous_namespace)::MembraneRequestHook>::instance;
      (__return_storage_ptr__->hook).ptr = pRVar15;
    }
    pDVar11 = local_110;
    if (local_110 != (Disposer *)0x0) {
      local_110 = (Disposer *)0x0;
      (**(code **)*(_func_int **)local_130._24_8_)
                (local_130._24_8_,pDVar11->_vptr_Disposer[-2] + (long)&pDVar11->_vptr_Disposer);
    }
  }
LAB_00315526:
  pCVar3 = local_e0;
  if ((local_f0[0] == true) && (local_e0 != (ClientHook *)0x0)) {
    local_e0 = (ClientHook *)0x0;
    (**local_e8->_vptr_Disposer)
              (local_e8,(_func_int *)
                        ((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]));
  }
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
      uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint,
      CallHints hints) override {
    KJ_IF_SOME(r, resolved) {
      return r->newCall(interfaceId, methodId, sizeHint, hints);
    }

    auto redirect = reverse
        ? policy->outboundCall(interfaceId, methodId, Capability::Client(inner->addRef()))
        : policy->inboundCall(interfaceId, methodId, Capability::Client(inner->addRef()));
    KJ_IF_SOME(r, redirect) {
      if (policy->shouldResolveBeforeRedirecting()) {
        // The policy says that *if* this capability points into the membrane, then we want to
        // redirect the call. However, if this capability is a promise, then it could resolve to
        // something outside the membrane later. We have to wait before we actually redirect,
        // otherwise behavior will differ depending on whether the promise is resolved.
        KJ_IF_SOME(p, whenMoreResolved()) {
          return newLocalPromiseClient(p.attach(addRef()))
              ->newCall(interfaceId, methodId, sizeHint, hints);
        }
      }

      return ClientHook::from(kj::mv(r))->newCall(interfaceId, methodId, sizeHint, hints);
    } else {
      // For pass-through calls, we don't worry about promises, because if the capability resolves
      // to something outside the membrane, then the call will pass back out of the membrane too.
      return MembraneRequestHook::wrap(
          inner->newCall(interfaceId, methodId, sizeHint, hints), *policy, reverse);
    }